

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O0

vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_> *
__thiscall tiger::trains::ai::PathCalculator::getMinPath(PathCalculator *this,Point *point)

{
  mapped_type *ppPVar1;
  mapped_type in_RDX;
  __normal_iterator<const_tiger::trains::world::Point_**,_std::vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>_>
  in_RDI;
  Point *temp_point;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  *vec;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_tiger::trains::world::Point_**,_std::vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>_>
  __first;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
  *in_stack_ffffffffffffffd0;
  mapped_type local_28;
  
  __first._M_current = in_RDI._M_current;
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::vector((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            *)0x25e6a4);
  ppPVar1 = std::
            map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
            ::operator[](in_stack_ffffffffffffffd0,
                         (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_28 = in_RDX;
  if (*ppPVar1 != (mapped_type)0x0) {
    while (ppPVar1 = std::
                     map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                     ::operator[](in_stack_ffffffffffffffd0,
                                  (key_type *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
          *ppPVar1 != local_28) {
      std::
      vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
      ::push_back((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                   *)__first._M_current,in_RDI._M_current);
      in_stack_ffffffffffffff88 =
           (vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            *)std::
              map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
              ::operator[](in_stack_ffffffffffffffd0,
                           (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          );
      local_28 = (mapped_type)
                 (in_stack_ffffffffffffff88->
                 super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
    ::push_back((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                 *)__first._M_current,in_RDI._M_current);
    std::
    vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
    ::begin(in_stack_ffffffffffffff88);
    std::
    vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
    ::end(in_stack_ffffffffffffff88);
    std::
    reverse<__gnu_cxx::__normal_iterator<tiger::trains::world::Point_const**,std::vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>>>
              (__first,in_RDI);
  }
  return (vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
          *)__first._M_current;
}

Assistant:

std::vector<const world::Point *> PathCalculator::getMinPath(const world::Point *point)
{
    std::vector<const world::Point *> vec;
    const world::Point *temp_point=point;

    if (ancestors[temp_point] == nullptr)
        return vec;

    while (ancestors[temp_point] != temp_point)
    {
        vec.push_back(temp_point);
        temp_point = ancestors[temp_point];
    }

    vec.push_back(temp_point);
    std::reverse(vec.begin(), vec.end());

    return vec;
}